

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigSavePattern(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  pVVar1 = p->pManFraig->vPis;
  iVar5 = pVVar1->nSize;
  if (0 < iVar5) {
    ppvVar2 = pVVar1->pArray;
    piVar3 = p->pSat->model;
    uVar4 = 0;
    do {
      if (piVar3[*(int *)((long)ppvVar2[uVar4] + 0x28)] == 1) {
        p->pPatWords[uVar4 >> 5 & 0x7ffffff] =
             p->pPatWords[uVar4 >> 5 & 0x7ffffff] | 1 << ((byte)uVar4 & 0x1f);
        iVar5 = pVVar1->nSize;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)iVar5);
  }
  return;
}

Assistant:

void Ivy_FraigSavePattern( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Ivy_ManForEachPi( p->pManFraig, pObj, i )
//    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True )
        if ( p->pSat->model[Ivy_ObjSatNum(pObj)] == l_True )
            Ivy_InfoSetBit( p->pPatWords, i );
//            Ivy_InfoSetBit( p->pPatWords, pObj->Id - 1 );
}